

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

uint64_t __thiscall bitfoot::Bitfoot::BishopXO(Bitfoot *this,int sqr)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int sqr_local;
  Bitfoot *this_local;
  
  if ((sqr & 0xffffffc0U) != 0) {
    __assert_fail("IS_SQUARE(sqr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0x243,"uint64_t bitfoot::Bitfoot::BishopXO(const int) const");
  }
  uVar1 = NorthEastXO(this,sqr);
  uVar2 = NorthWestXO(this,sqr);
  uVar3 = SouthEastXO(this,sqr);
  uVar4 = SouthWestXO(this,sqr);
  return uVar1 | uVar2 | uVar3 | uVar4;
}

Assistant:

inline uint64_t BishopXO(const int sqr) const {
    assert(IS_SQUARE(sqr));
    return (NorthEastXO(sqr) | NorthWestXO(sqr) |
            SouthEastXO(sqr) | SouthWestXO(sqr));
  }